

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void cache_features(io_buf *cache,example *ae,uint64_t mask)

{
  v_array<char> tag;
  uchar **ppuVar1;
  uchar *puVar2;
  v_array<unsigned_char> *in_RSI;
  uint64_t in_stack_00000008;
  features *in_stack_00000010;
  uchar in_stack_0000001f;
  io_buf *in_stack_00000020;
  namespace_index ns;
  uchar *__end1;
  uchar *__begin1;
  v_array<unsigned_char> *__range1;
  size_t sVar3;
  io_buf *cache_00;
  io_buf *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  uchar *puVar4;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  uchar s;
  
  sVar3 = in_RSI[0x343].erase_count;
  cache_00 = (io_buf *)in_RSI[0x344]._begin;
  tag._end = (char *)in_stack_ffffffffffffffb8;
  tag._begin = (char *)in_stack_ffffffffffffffb0;
  tag.end_array = (char *)in_stack_ffffffffffffffc0;
  tag.erase_count = sVar3;
  cache_tag(in_stack_ffffffffffffffa0,tag);
  s = (uchar)(sVar3 >> 0x38);
  v_array<unsigned_char>::size(in_RSI);
  output_byte(cache_00,s);
  ppuVar1 = v_array<unsigned_char>::begin(in_RSI);
  puVar2 = *ppuVar1;
  ppuVar1 = v_array<unsigned_char>::end(in_RSI);
  puVar4 = *ppuVar1;
  for (; puVar2 != puVar4; puVar2 = puVar2 + 1) {
    output_features(in_stack_00000020,in_stack_0000001f,in_stack_00000010,in_stack_00000008);
  }
  return;
}

Assistant:

void cache_features(io_buf& cache, example* ae, uint64_t mask)
{
  cache_tag(cache, ae->tag);
  output_byte(cache, (unsigned char)ae->indices.size());

  for (namespace_index ns : ae->indices) output_features(cache, ns, ae->feature_space[ns], mask);
}